

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::OptConstFoldBinary
          (GlobOpt *this,Instr **pInstr,IntConstantBounds *src1IntConstantBounds,
          IntConstantBounds *src2IntConstantBounds,Value **pDstVal)

{
  StackSym *this_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  Opnd *this_01;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  Instr *pIVar5;
  StackSym *dstSym;
  Opnd *dst;
  IntConstType tmpValueOut;
  int32 src2MinIntConstantValue;
  int32 src1MinIntConstantValue;
  int32 src2MaxIntConstantValue;
  int32 src1MaxIntConstantValue;
  int32 src2IntConstantValue;
  int32 src1IntConstantValue;
  IntConstOpnd *constOpnd;
  Instr **ppIStack_40;
  int32 value;
  Instr **instr;
  Value **pDstVal_local;
  IntConstantBounds *src2IntConstantBounds_local;
  IntConstantBounds *src1IntConstantBounds_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  ppIStack_40 = pInstr;
  instr = (Instr **)pDstVal;
  pDstVal_local = (Value **)src2IntConstantBounds;
  src2IntConstantBounds_local = src1IntConstantBounds;
  src1IntConstantBounds_local = (IntConstantBounds *)pInstr;
  pInstr_local = (Instr **)this;
  bVar2 = DoConstFold(this);
  if (bVar2) {
    src1MaxIntConstantValue = -1;
    src2MaxIntConstantValue = -1;
    src1MinIntConstantValue = -1;
    src2MinIntConstantValue = -1;
    tmpValueOut._4_4_ = -1;
    tmpValueOut._0_4_ = -1;
    bVar2 = IR::Instr::IsBranchInstr(*ppIStack_40);
    if (bVar2) {
      tmpValueOut._4_4_ = IntConstantBounds::LowerBound(src2IntConstantBounds_local);
      src1MinIntConstantValue = IntConstantBounds::UpperBound(src2IntConstantBounds_local);
      tmpValueOut._0_4_ = IntConstantBounds::LowerBound((IntConstantBounds *)pDstVal_local);
      src2MinIntConstantValue = IntConstantBounds::UpperBound((IntConstantBounds *)pDstVal_local);
    }
    else {
      bVar2 = IntConstantBounds::IsConstant(src2IntConstantBounds_local);
      if ((!bVar2) ||
         (bVar2 = IntConstantBounds::IsConstant((IntConstantBounds *)pDstVal_local), !bVar2)) {
        return false;
      }
      src1MaxIntConstantValue = IntConstantBounds::LowerBound(src2IntConstantBounds_local);
      src2MaxIntConstantValue = IntConstantBounds::LowerBound((IntConstantBounds *)pDstVal_local);
    }
    bVar2 = IR::Instr::BinaryCalculator
                      (*ppIStack_40,(long)src1MaxIntConstantValue,(long)src2MaxIntConstantValue,
                       (IntConstType *)&dst,TyInt32);
    if ((bVar2) && (bVar2 = Math::FitsInDWord((int64)dst), bVar2)) {
      constOpnd._4_4_ = (uint)dst;
      CaptureByteCodeSymUses(this,*ppIStack_40);
      _src2IntConstantValue =
           IR::IntConstOpnd::New((long)(int)constOpnd._4_4_,TyInt32,(*ppIStack_40)->m_func,false);
      IR::Instr::ReplaceSrc1(*ppIStack_40,&_src2IntConstantValue->super_Opnd);
      IR::Instr::FreeSrc2(*ppIStack_40);
      OptSrc(this,&_src2IntConstantValue->super_Opnd,ppIStack_40,(Value **)0x0,(IndirOpnd *)0x0);
      this_01 = IR::Instr::GetDst(*ppIStack_40);
      bVar2 = IR::Opnd::IsRegOpnd(this_01);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3118,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pRVar4 = IR::Opnd::AsRegOpnd(this_01);
      this_00 = pRVar4->m_sym;
      bVar2 = StackSym::IsSingleDef(this_00);
      if (bVar2) {
        StackSym::SetIsIntConst(this_00,(long)(int)constOpnd._4_4_);
      }
      sourceContextId = Func::GetSourceContextId(this->func);
      functionId = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,sourceContextId,functionId)
      ;
      if (bVar2) {
        Output::Print(L"TRACE ");
        bVar2 = IsLoopPrePass(this);
        if (bVar2) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Constant folding to %d: \n",(ulong)constOpnd._4_4_);
        IR::Instr::Dump(*ppIStack_40);
        Output::Flush();
      }
      pIVar5 = (Instr *)GetIntConstantValue(this,constOpnd._4_4_,*ppIStack_40,this_01);
      *instr = pIVar5;
      bVar2 = IsTypeSpecPhaseOff(this->func);
      if (bVar2) {
        (*ppIStack_40)->m_opcode = LdC_A_I4;
        pRVar4 = IR::Opnd::AsRegOpnd(this_01);
        ToVarRegOpnd(this,pRVar4,this->currentBlock);
      }
      else {
        (*ppIStack_40)->m_opcode = Ld_I4;
        pIVar5 = *ppIStack_40;
        pRVar4 = IR::Opnd::AsRegOpnd(this_01);
        ToInt32Dst(this,pIVar5,pRVar4,this->currentBlock);
      }
      InvalidateInductionVariables(this,*ppIStack_40);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::OptConstFoldBinary(
    IR::Instr * *pInstr,
    const IntConstantBounds &src1IntConstantBounds,
    const IntConstantBounds &src2IntConstantBounds,
    Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    int32 value;
    IR::IntConstOpnd *constOpnd;

    if (!DoConstFold())
    {
        return false;
    }

    int32 src1IntConstantValue = -1;
    int32 src2IntConstantValue = -1;

    int32 src1MaxIntConstantValue = -1;
    int32 src2MaxIntConstantValue = -1;
    int32 src1MinIntConstantValue = -1;
    int32 src2MinIntConstantValue = -1;

    if (instr->IsBranchInstr())
    {
        src1MinIntConstantValue = src1IntConstantBounds.LowerBound();
        src1MaxIntConstantValue = src1IntConstantBounds.UpperBound();
        src2MinIntConstantValue = src2IntConstantBounds.LowerBound();
        src2MaxIntConstantValue = src2IntConstantBounds.UpperBound();
    }
    else if (src1IntConstantBounds.IsConstant() && src2IntConstantBounds.IsConstant())
    {
        src1IntConstantValue = src1IntConstantBounds.LowerBound();
        src2IntConstantValue = src2IntConstantBounds.LowerBound();
    }
    else
    {
        return false;
    }

    IntConstType tmpValueOut;
    if (!instr->BinaryCalculator(src1IntConstantValue, src2IntConstantValue, &tmpValueOut, TyInt32)
        || !Math::FitsInDWord(tmpValueOut))
    {
        return false;
    }

    value = (int32)tmpValueOut;

    this->CaptureByteCodeSymUses(instr);
    constOpnd = IR::IntConstOpnd::New(value, TyInt32, instr->m_func);
    instr->ReplaceSrc1(constOpnd);
    instr->FreeSrc2();

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    Assert(dst->IsRegOpnd());

    StackSym *dstSym = dst->AsRegOpnd()->m_sym;

    if (dstSym->IsSingleDef())
    {
        dstSym->SetIsIntConst(value);
    }

    GOPT_TRACE_INSTR(instr, _u("Constant folding to %d: \n"), value);

    *pDstVal = GetIntConstantValue(value, instr, dst);

    if (IsTypeSpecPhaseOff(this->func))
    {
        instr->m_opcode = Js::OpCode::LdC_A_I4;
        this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
    }
    else
    {
        instr->m_opcode = Js::OpCode::Ld_I4;
        this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
    }

    InvalidateInductionVariables(instr);

    return true;
}